

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbinode.cpp
# Opt level: O0

void __thiscall icu_63::RBBINode::flattenSets(RBBINode *this)

{
  RBBINode *pRVar1;
  RBBINode *pRVar2;
  void *in_RSI;
  RBBINode *replTree_1;
  RBBINode *usetNode_1;
  RBBINode *setRefNode_1;
  RBBINode *replTree;
  RBBINode *usetNode;
  RBBINode *setRefNode;
  RBBINode *this_local;
  
  if (this->fLeftChild != (RBBINode *)0x0) {
    if (this->fLeftChild->fType == setRef) {
      pRVar1 = this->fLeftChild;
      pRVar2 = cloneTree(pRVar1->fLeftChild->fLeftChild);
      this->fLeftChild = pRVar2;
      this->fLeftChild->fParent = this;
      if (pRVar1 != (RBBINode *)0x0) {
        ~RBBINode(pRVar1);
        UMemory::operator_delete((UMemory *)pRVar1,in_RSI);
      }
    }
    else {
      flattenSets(this->fLeftChild);
    }
  }
  if (this->fRightChild != (RBBINode *)0x0) {
    if (this->fRightChild->fType == setRef) {
      pRVar1 = this->fRightChild;
      pRVar2 = cloneTree(pRVar1->fLeftChild->fLeftChild);
      this->fRightChild = pRVar2;
      this->fRightChild->fParent = this;
      if (pRVar1 != (RBBINode *)0x0) {
        ~RBBINode(pRVar1);
        UMemory::operator_delete((UMemory *)pRVar1,in_RSI);
      }
    }
    else {
      flattenSets(this->fRightChild);
    }
  }
  return;
}

Assistant:

void RBBINode::flattenSets() {
    U_ASSERT(fType != setRef);

    if (fLeftChild != NULL) {
        if (fLeftChild->fType==setRef) {
            RBBINode *setRefNode = fLeftChild;
            RBBINode *usetNode   = setRefNode->fLeftChild;
            RBBINode *replTree   = usetNode->fLeftChild;
            fLeftChild           = replTree->cloneTree();
            fLeftChild->fParent  = this;
            delete setRefNode;
        } else {
            fLeftChild->flattenSets();
        }
    }

    if (fRightChild != NULL) {
        if (fRightChild->fType==setRef) {
            RBBINode *setRefNode = fRightChild;
            RBBINode *usetNode   = setRefNode->fLeftChild;
            RBBINode *replTree   = usetNode->fLeftChild;
            fRightChild           = replTree->cloneTree();
            fRightChild->fParent  = this;
            delete setRefNode;
        } else {
            fRightChild->flattenSets();
        }
    }
}